

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

void __thiscall
ot::commissioner::CommissionerImpl::CommandMigrate
          (CommissionerImpl *this,ErrorHandler *aHandler,string *aDstAddr,string *aDstNetworkName)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  Error *pEVar4;
  ulong uVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  Error local_710;
  ErrorCode local_6e8;
  anon_class_1_0_00000001 local_6e2;
  v10 local_6e1;
  v10 *local_6e0;
  size_t local_6d8;
  string local_6d0;
  allocator local_6a9;
  string local_6a8;
  ResponseHandler local_688;
  ErrorCode local_664;
  Error local_660;
  ErrorCode local_634;
  Tlv local_630;
  Error local_610;
  ErrorCode local_5e4;
  Tlv local_5e0;
  Error local_5c0;
  ErrorCode local_598;
  allocator local_591;
  string local_590;
  Error local_570;
  undefined8 local_548;
  anon_class_1_0_00000001 local_53a;
  v10 local_539;
  v10 *local_538;
  char *local_530;
  string local_528;
  Error local_508;
  ErrorCode local_4dc;
  Error local_4d8;
  anon_class_1_0_00000001 local_4aa;
  v10 local_4a9;
  v10 *local_4a8;
  size_t local_4a0;
  string local_498;
  Error local_478;
  anon_class_1_0_00000001 local_44a;
  v10 local_449;
  v10 *local_448;
  size_t local_440;
  string local_438;
  Error local_418;
  undefined1 local_3f0 [8];
  anon_class_32_1_d0c21527 onResponse;
  undefined1 local_3c0 [8];
  Request request;
  Address dstAddr;
  Error error;
  string *aDstNetworkName_local;
  string *aDstAddr_local;
  ErrorHandler *aHandler_local;
  CommissionerImpl *this_local;
  undefined1 local_2b0 [16];
  v10 *local_2a0;
  char *local_298;
  undefined8 *local_290;
  v10 *local_288;
  v10 *local_280;
  char *pcStack_278;
  string *local_270;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_268 [3];
  undefined1 local_250 [16];
  v10 *local_240;
  ulong local_238;
  v10 *local_230;
  size_t sStack_228;
  string *local_220;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_218 [3];
  undefined1 local_200 [16];
  v10 *local_1f0;
  ulong local_1e8;
  v10 *local_1e0;
  size_t sStack_1d8;
  string *local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1c8 [2];
  undefined1 local_1b8 [16];
  v10 *local_1a8;
  ulong local_1a0;
  v10 *local_198;
  size_t sStack_190;
  string *local_188;
  v10 *local_180;
  v10 **local_178;
  v10 *local_170;
  v10 **local_168;
  v10 *local_160;
  v10 **local_158;
  v10 *local_150;
  v10 **local_148;
  v10 **local_140;
  v10 *local_138;
  size_t sStack_130;
  v10 **local_120;
  v10 *local_118;
  size_t sStack_110;
  v10 **local_100;
  v10 *local_f8;
  size_t sStack_f0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_e0;
  undefined1 *local_d8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_d0;
  undefined8 local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined1 *local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_90;
  undefined1 *local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_80;
  undefined8 local_78;
  undefined1 *local_70;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_68;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_60;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  CommissionerImpl **local_38;
  undefined1 *local_30;
  CommissionerImpl **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  CommissionerImpl **local_10;
  
  Error::Error((Error *)&dstAddr.mBytes.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
  Address::Address((Address *)&request.mEndpoint);
  coap::Message::Message((Message *)local_3c0,kConfirmable,kPost);
  std::function<void_(ot::commissioner::Error)>::function
            ((function<void_(ot::commissioner::Error)> *)local_3f0,aHandler);
  uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[9])();
  if ((uVar2 & 1) == 0) {
    CommandMigrate::anon_class_1_0_00000001::operator()(&local_44a);
    local_178 = &local_448;
    local_180 = &local_449;
    bVar6 = ::fmt::v10::operator()(local_180);
    local_440 = bVar6.size_;
    local_448 = (v10 *)bVar6.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_188 = &local_438;
    local_198 = local_448;
    sStack_190 = local_440;
    local_140 = &local_198;
    local_1a8 = local_448;
    local_1a0 = local_440;
    local_138 = local_1a8;
    sStack_130 = local_1a0;
    local_1c8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_d8 = local_1b8;
    local_e0 = local_1c8;
    local_c8 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_1a0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_e0;
    local_d0 = local_e0;
    local_c0 = local_d8;
    local_58 = local_e0;
    ::fmt::v10::vformat_abi_cxx11_(&local_438,local_1a8,fmt,args);
    Error::Error(&local_418,kInvalidState,&local_438);
    Error::operator=((Error *)&dstAddr.mBytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_418);
    Error::~Error(&local_418);
    std::__cxx11::string::~string((string *)&local_438);
  }
  else {
    uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
    if ((uVar2 & 1) == 0) {
      CommandMigrate::anon_class_1_0_00000001::operator()(&local_4aa);
      local_168 = &local_4a8;
      local_170 = &local_4a9;
      bVar6 = ::fmt::v10::operator()(local_170);
      local_4a0 = bVar6.size_;
      local_4a8 = (v10 *)bVar6.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_1d0 = &local_498;
      local_1e0 = local_4a8;
      sStack_1d8 = local_4a0;
      local_120 = &local_1e0;
      local_1f0 = local_4a8;
      local_1e8 = local_4a0;
      local_118 = local_1f0;
      sStack_110 = local_1e8;
      local_218[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_b0 = local_200;
      local_b8 = local_218;
      local_a0 = 0;
      fmt_00.size_ = 0;
      fmt_00.data_ = (char *)local_1e8;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_b8;
      local_a8 = local_b8;
      local_98 = local_b0;
      local_60 = local_b8;
      ::fmt::v10::vformat_abi_cxx11_(&local_498,local_1f0,fmt_00,args_00);
      Error::Error(&local_478,kInvalidState,&local_498);
      Error::operator=((Error *)&dstAddr.mBytes.
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage,&local_478);
      Error::~Error(&local_478);
      std::__cxx11::string::~string((string *)&local_498);
    }
    else {
      Address::Set(&local_4d8,(Address *)&request.mEndpoint,aDstAddr);
      pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                &local_4d8);
      local_4dc = kNone;
      bVar1 = commissioner::operator!=(pEVar4,&local_4dc);
      Error::~Error(&local_4d8);
      if (!bVar1) {
        uVar5 = std::__cxx11::string::size();
        if (uVar5 < 0x11) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_590,"/c/nm",&local_591);
          coap::Message::SetUriPath(&local_570,(Message *)local_3c0,&local_590);
          pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    &local_570);
          local_598 = kNone;
          bVar1 = commissioner::operator!=(pEVar4,&local_598);
          Error::~Error(&local_570);
          std::__cxx11::string::~string((string *)&local_590);
          std::allocator<char>::~allocator((allocator<char> *)&local_591);
          if (!bVar1) {
            iVar3 = (*(this->super_Commissioner)._vptr_Commissioner[7])();
            tlv::Tlv::Tlv(&local_5e0,kCommissionerSessionId,(uint16_t)iVar3,kMeshCoP);
            AppendTlv(&local_5c0,(Message *)local_3c0,&local_5e0);
            pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                      &local_5c0);
            local_5e4 = kNone;
            bVar1 = commissioner::operator!=(pEVar4,&local_5e4);
            Error::~Error(&local_5c0);
            tlv::Tlv::~Tlv(&local_5e0);
            if (!bVar1) {
              tlv::Tlv::Tlv(&local_630,kNetworkDiagTimeout,aDstNetworkName,kMeshCoP);
              AppendTlv(&local_610,(Message *)local_3c0,&local_630);
              pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                        ,&local_610);
              local_634 = kNone;
              bVar1 = commissioner::operator!=(pEVar4,&local_634);
              Error::~Error(&local_610);
              tlv::Tlv::~Tlv(&local_630);
              if (!bVar1) {
                uVar2 = (*(this->super_Commissioner)._vptr_Commissioner[10])();
                if ((uVar2 & 1) != 0) {
                  SignRequest(&local_660,this,(Request *)local_3c0,kMeshCoP,true);
                  pEVar4 = Error::operator=((Error *)&dstAddr.mBytes.
                                                                                                            
                                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            ,&local_660);
                  local_664 = kNone;
                  bVar1 = commissioner::operator!=(pEVar4,&local_664);
                  Error::~Error(&local_660);
                  if (bVar1) goto LAB_0027676f;
                }
                std::function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>
                ::
                function<ot::commissioner::CommissionerImpl::CommandMigrate(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,std::__cxx11::string_const&)::__1&,void>
                          ((function<void(ot::commissioner::coap::Message_const*,ot::commissioner::Error)>
                            *)&local_688,(anon_class_32_1_d0c21527 *)local_3f0);
                ProxyClient::SendRequest
                          (&this->mProxyClient,(Request *)local_3c0,&local_688,
                           (Address *)&request.mEndpoint,0xf0bf);
                std::
                function<void_(const_ot::commissioner::coap::Message_*,_ot::commissioner::Error)>::
                ~function(&local_688);
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)&local_6a8,"mgmt",&local_6a9);
                CommandMigrate::anon_class_1_0_00000001::operator()(&local_6e2);
                local_148 = &local_6e0;
                local_150 = &local_6e1;
                bVar6 = ::fmt::v10::operator()(local_150);
                local_6d8 = bVar6.size_;
                local_6e0 = (v10 *)bVar6.data_;
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                local_220 = &local_6d0;
                local_230 = local_6e0;
                sStack_228 = local_6d8;
                local_100 = &local_230;
                local_240 = local_6e0;
                local_238 = local_6d8;
                local_f8 = local_240;
                sStack_f0 = local_238;
                local_268[0] = ::fmt::v10::
                               make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>
                                         ();
                local_88 = local_250;
                local_90 = local_268;
                local_78 = 0;
                fmt_02.size_ = 0;
                fmt_02.data_ = (char *)local_238;
                args_02.field_1.values_ = in_R9.values_;
                args_02.desc_ = (unsigned_long_long)local_90;
                local_80 = local_90;
                local_70 = local_88;
                local_68 = local_90;
                ::fmt::v10::vformat_abi_cxx11_(&local_6d0,local_240,fmt_02,args_02);
                Log(kDebug,&local_6a8,&local_6d0);
                std::__cxx11::string::~string((string *)&local_6d0);
                std::__cxx11::string::~string((string *)&local_6a8);
                std::allocator<char>::~allocator((allocator<char> *)&local_6a9);
              }
            }
          }
        }
        else {
          CommandMigrate::anon_class_1_0_00000001::operator()(&local_53a);
          local_158 = &local_538;
          local_160 = &local_539;
          bVar6 = ::fmt::v10::operator()(local_160);
          local_530 = (char *)bVar6.size_;
          local_538 = (v10 *)bVar6.data_;
          ::fmt::v10::detail::
          check_format_string<unsigned_long,_const_unsigned_long_&,_FMT_COMPILE_STRING,_0>();
          local_548 = std::__cxx11::string::size();
          local_270 = &local_528;
          local_280 = local_538;
          pcStack_278 = local_530;
          local_288 = (v10 *)&local_548;
          local_290 = &kMaxNetworkNameLength;
          local_50 = &local_280;
          local_2a0 = local_538;
          local_298 = local_530;
          local_48 = local_2a0;
          pcStack_40 = local_298;
          ::fmt::v10::
          make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,unsigned_long,unsigned_long_const>
                    ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_unsigned_long,_unsigned_long>
                      *)&this_local,local_288,&kMaxNetworkNameLength,(unsigned_long *)local_538);
          local_30 = local_2b0;
          local_38 = &this_local;
          local_20 = 0x44;
          fmt_01.size_ = 0x44;
          fmt_01.data_ = local_298;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)local_38;
          local_28 = local_38;
          local_18 = local_30;
          local_10 = local_38;
          ::fmt::v10::vformat_abi_cxx11_(&local_528,local_2a0,fmt_01,args_01);
          Error::Error(&local_508,kInvalidArgs,&local_528);
          Error::operator=((Error *)&dstAddr.mBytes.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_508);
          Error::~Error(&local_508);
          std::__cxx11::string::~string((string *)&local_528);
        }
      }
    }
  }
LAB_0027676f:
  local_6e8 = kNone;
  bVar1 = commissioner::operator!=
                    ((Error *)&dstAddr.mBytes.
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_end_of_storage,&local_6e8);
  if (bVar1) {
    Error::Error(&local_710,
                 (Error *)&dstAddr.mBytes.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
    std::function<void_(ot::commissioner::Error)>::operator()(aHandler,&local_710);
    Error::~Error(&local_710);
  }
  CommandMigrate(std::function<void(ot::commissioner::Error)>,std::__cxx11::string_const&,std::__cxx11::string_const&)
  ::$_1::~__1((__1 *)local_3f0);
  coap::Message::~Message((Message *)local_3c0);
  Address::~Address((Address *)&request.mEndpoint);
  Error::~Error((Error *)&dstAddr.mBytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

void CommissionerImpl::CommandMigrate(ErrorHandler       aHandler,
                                      const std::string &aDstAddr,
                                      const std::string &aDstNetworkName)
{
    Error         error;
    Address       dstAddr;
    coap::Request request{coap::Type::kConfirmable, coap::Code::kPost};

    auto onResponse = [aHandler](const coap::Response *aResponse, Error aError) {
        aHandler(HandleStateResponse(aResponse, aError, /* aStateTlvIsMandatory */ false));
    };

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));
    VerifyOrExit(IsCcmMode(), error = ERROR_INVALID_STATE("Migrating a Device is only valid in CCM Mode"));

    SuccessOrExit(error = dstAddr.Set(aDstAddr));
    VerifyOrExit(aDstNetworkName.size() <= kMaxNetworkNameLength,
                 error =
                     ERROR_INVALID_ARGS("Network Name length={} > {}", aDstNetworkName.size(), kMaxNetworkNameLength));

    SuccessOrExit(error = request.SetUriPath(uri::kMgmtNetMigrate));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kCommissionerSessionId, GetSessionId()}));
    SuccessOrExit(error = AppendTlv(request, {tlv::Type::kNetworkName, aDstNetworkName}));

    if (IsCcmMode())
    {
        SuccessOrExit(error = SignRequest(request));
    }

    mProxyClient.SendRequest(request, onResponse, dstAddr, kDefaultMmPort);

    LOG_DEBUG(LOG_REGION_MGMT, "sent MGMT_NET_MIGRATE.req");

exit:
    if (error != ErrorCode::kNone)
    {
        aHandler(error);
    }
}